

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_bench_sqlite3.cc
# Opt level: O1

void __thiscall leveldb::Benchmark::Stop(Benchmark *this,Slice *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  FILE *pFVar2;
  int iVar3;
  Env *pEVar4;
  undefined4 extraout_var;
  size_t sVar5;
  long *plVar6;
  long *plVar7;
  char *pcVar8;
  undefined1 auVar9 [16];
  char rate [100];
  undefined1 *local_108 [2];
  undefined1 local_f8 [16];
  long *local_e8;
  long local_e0;
  long local_d8;
  long lStack_d0;
  double local_c8;
  double dStack_c0;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  string local_98 [3];
  
  pEVar4 = Env::Default();
  iVar3 = (*pEVar4->_vptr_Env[0x13])(pEVar4);
  auVar9._4_4_ = extraout_var;
  auVar9._0_4_ = iVar3;
  auVar9._8_4_ = extraout_var;
  auVar9._12_4_ = 0x45300000;
  dStack_c0 = auVar9._8_8_ - 1.9342813113834067e+25;
  if (this->done_ < 1) {
    this->done_ = 1;
  }
  local_c8 = (dStack_c0 + ((double)CONCAT44(0x43300000,iVar3) - 4503599627370496.0)) * 1e-06;
  if (0 < this->bytes_) {
    snprintf((char *)local_98,100,"%6.1f MB/s",
             ((double)this->bytes_ * 9.5367431640625e-07) / (local_c8 - this->start_));
    if ((this->message_)._M_string_length == 0) {
      strlen((char *)local_98);
      std::__cxx11::string::_M_replace((ulong)&this->message_,0,(char *)0x0,(ulong)local_98);
    }
    else {
      local_108[0] = local_f8;
      sVar5 = strlen((char *)local_98);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_108,local_98,(long)&local_98[0]._M_dataplus._M_p + sVar5);
      plVar6 = (long *)std::__cxx11::string::append((char *)local_108);
      plVar7 = plVar6 + 2;
      if ((long *)*plVar6 == plVar7) {
        local_d8 = *plVar7;
        lStack_d0 = plVar6[3];
        local_e8 = &local_d8;
      }
      else {
        local_d8 = *plVar7;
        local_e8 = (long *)*plVar6;
      }
      local_e0 = plVar6[1];
      *plVar6 = (long)plVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_e8,(ulong)(this->message_)._M_dataplus._M_p);
      plVar7 = plVar6 + 2;
      if ((long *)*plVar6 == plVar7) {
        local_a8 = *plVar7;
        lStack_a0 = plVar6[3];
        local_b8 = &local_a8;
      }
      else {
        local_a8 = *plVar7;
        local_b8 = (long *)*plVar6;
      }
      local_b0 = plVar6[1];
      *plVar6 = (long)plVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::string::operator=((string *)&this->message_,(string *)&local_b8);
      if (local_b8 != &local_a8) {
        operator_delete(local_b8);
      }
      if (local_e8 != &local_d8) {
        operator_delete(local_e8);
      }
      if (local_108[0] != local_f8) {
        operator_delete(local_108[0]);
      }
    }
  }
  pFVar2 = _stdout;
  paVar1 = &local_98[0].field_2;
  local_98[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_98,name->data_,name->data_ + name->size_);
  pcVar8 = " ";
  if ((this->message_)._M_string_length == 0) {
    pcVar8 = "";
  }
  fprintf(pFVar2,"%-12s : %11.3f micros/op;%s%s\n",
          ((local_c8 - this->start_) * 1000000.0) / (double)this->done_,local_98[0]._M_dataplus._M_p
          ,pcVar8,(this->message_)._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_98[0]._M_dataplus._M_p);
  }
  pFVar2 = _stdout;
  if (FLAGS_histogram == true) {
    Histogram::ToString_abi_cxx11_(local_98,&this->hist_);
    fprintf(pFVar2,"Microseconds per op:\n%s\n",local_98[0]._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_98[0]._M_dataplus._M_p);
    }
  }
  fflush(_stdout);
  return;
}

Assistant:

void Stop(const Slice& name) {
    double finish = Env::Default()->NowMicros() * 1e-6;

    // Pretend at least one op was done in case we are running a benchmark
    // that does not call FinishedSingleOp().
    if (done_ < 1) done_ = 1;

    if (bytes_ > 0) {
      char rate[100];
      snprintf(rate, sizeof(rate), "%6.1f MB/s",
               (bytes_ / 1048576.0) / (finish - start_));
      if (!message_.empty()) {
        message_ = std::string(rate) + " " + message_;
      } else {
        message_ = rate;
      }
    }

    fprintf(stdout, "%-12s : %11.3f micros/op;%s%s\n", name.ToString().c_str(),
            (finish - start_) * 1e6 / done_, (message_.empty() ? "" : " "),
            message_.c_str());
    if (FLAGS_histogram) {
      fprintf(stdout, "Microseconds per op:\n%s\n", hist_.ToString().c_str());
    }
    fflush(stdout);
  }